

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2dae49::PpuTest_clear_vblank_flag_during_pre_render_line_Test::
~PpuTest_clear_vblank_flag_during_pre_render_line_Test
          (PpuTest_clear_vblank_flag_during_pre_render_line_Test *this)

{
  PpuTest_clear_vblank_flag_during_pre_render_line_Test *this_local;
  
  ~PpuTest_clear_vblank_flag_during_pre_render_line_Test(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

TEST_F(PpuTest, clear_vblank_flag_during_pre_render_line) {
    registers.status = PpuStatus(0x00);
    expected.status = PpuStatus(0x00);
    expected.cycle = 2;
    expected.scanline = 261;

    // The VBlank flag is cleared at the second cycle of scanline 261
    step_execution(kCyclesPerScanline * 261 + 2);

    EXPECT_EQ(expected, registers);
}